

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_fp_fcvt(DisasContext_conflict1 *s,int opcode,int rd,int rn,int dtype,int ntype)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_ptr pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 tcg_rd_4;
  TCGv_i32 tcg_rd_3;
  TCGv_i32 tcg_ahp;
  TCGv_ptr tcg_fpst;
  TCGv_i32 tcg_rn_2;
  TCGv_i32 ahp_1;
  TCGv_ptr fpst_1;
  TCGv_i32 tcg_rd_2;
  TCGv_i64 tcg_rn_1;
  TCGv_ptr fpst;
  TCGv_i32 ahp;
  TCGv_i32 tcg_rd_1;
  TCGv_i64 tcg_rd;
  TCGv_i32 tcg_rn;
  TCGContext_conflict1 *tcg_ctx;
  int ntype_local;
  int dtype_local;
  int rn_local;
  int rd_local;
  int opcode_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (ntype == 0) {
    pTVar1 = read_fp_sreg(s,rn);
    if (dtype == 1) {
      pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
      gen_helper_vfp_fcvtds(tcg_ctx_00,pTVar5,pTVar1,tcg_ctx_00->cpu_env);
      write_fp_dreg_aarch64(s,rd,pTVar5);
      tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    }
    else {
      pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar4 = get_ahp_flag(tcg_ctx_00);
      pTVar2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,false);
      gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx_00,pTVar3,pTVar1,pTVar2,pTVar4);
      write_fp_sreg(s,rd,pTVar3);
      tcg_temp_free_i32(tcg_ctx_00,pTVar3);
      tcg_temp_free_i32(tcg_ctx_00,pTVar4);
      tcg_temp_free_ptr(tcg_ctx_00,pTVar2);
    }
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
  }
  else if (ntype == 1) {
    pTVar5 = read_fp_dreg(s,rn);
    pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
    if (dtype == 0) {
      gen_helper_vfp_fcvtsd(tcg_ctx_00,pTVar1,pTVar5,tcg_ctx_00->cpu_env);
    }
    else {
      pTVar2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,false);
      pTVar3 = get_ahp_flag(tcg_ctx_00);
      gen_helper_vfp_fcvt_f64_to_f16(tcg_ctx_00,pTVar1,pTVar5,pTVar2,pTVar3);
      tcg_temp_free_ptr(tcg_ctx_00,pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    }
    write_fp_sreg(s,rd,pTVar1);
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
  }
  else {
    if (ntype != 3) {
      abort();
    }
    pTVar1 = read_fp_sreg(s,rn);
    pTVar2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,false);
    pTVar3 = get_ahp_flag(tcg_ctx_00);
    tcg_gen_ext16u_i32_aarch64(tcg_ctx_00,pTVar1,pTVar1);
    if (dtype == 0) {
      pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
      gen_helper_vfp_fcvt_f16_to_f32(tcg_ctx_00,pTVar4,pTVar1,pTVar2,pTVar3);
      write_fp_sreg(s,rd,pTVar4);
      tcg_temp_free_i32(tcg_ctx_00,pTVar4);
    }
    else {
      pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
      gen_helper_vfp_fcvt_f16_to_f64(tcg_ctx_00,pTVar5,pTVar1,pTVar2,pTVar3);
      write_fp_dreg_aarch64(s,rd,pTVar5);
      tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    }
    tcg_temp_free_i32(tcg_ctx_00,pTVar1);
    tcg_temp_free_ptr(tcg_ctx_00,pTVar2);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
  }
  return;
}

Assistant:

static void handle_fp_fcvt(DisasContext *s, int opcode,
                           int rd, int rn, int dtype, int ntype)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    switch (ntype) {
    case 0x0:
    {
        TCGv_i32 tcg_rn = read_fp_sreg(s, rn);
        if (dtype == 1) {
            /* Single to double */
            TCGv_i64 tcg_rd = tcg_temp_new_i64(tcg_ctx);
            gen_helper_vfp_fcvtds(tcg_ctx, tcg_rd, tcg_rn, tcg_ctx->cpu_env);
            write_fp_dreg(s, rd, tcg_rd);
            tcg_temp_free_i64(tcg_ctx, tcg_rd);
        } else {
            /* Single to half */
            TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 ahp = get_ahp_flag(tcg_ctx);
            TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);

            gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_rd, tcg_rn, fpst, ahp);
            /* write_fp_sreg is OK here because top half of tcg_rd is zero */
            write_fp_sreg(s, rd, tcg_rd);
            tcg_temp_free_i32(tcg_ctx, tcg_rd);
            tcg_temp_free_i32(tcg_ctx, ahp);
            tcg_temp_free_ptr(tcg_ctx, fpst);
        }
        tcg_temp_free_i32(tcg_ctx, tcg_rn);
        break;
    }
    case 0x1:
    {
        TCGv_i64 tcg_rn = read_fp_dreg(s, rn);
        TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);
        if (dtype == 0) {
            /* Double to single */
            gen_helper_vfp_fcvtsd(tcg_ctx, tcg_rd, tcg_rn, tcg_ctx->cpu_env);
        } else {
            TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);
            TCGv_i32 ahp = get_ahp_flag(tcg_ctx);
            /* Double to half */
            gen_helper_vfp_fcvt_f64_to_f16(tcg_ctx, tcg_rd, tcg_rn, fpst, ahp);
            /* write_fp_sreg is OK here because top half of tcg_rd is zero */
            tcg_temp_free_ptr(tcg_ctx, fpst);
            tcg_temp_free_i32(tcg_ctx, ahp);
        }
        write_fp_sreg(s, rd, tcg_rd);
        tcg_temp_free_i32(tcg_ctx, tcg_rd);
        tcg_temp_free_i64(tcg_ctx, tcg_rn);
        break;
    }
    case 0x3:
    {
        TCGv_i32 tcg_rn = read_fp_sreg(s, rn);
        TCGv_ptr tcg_fpst = get_fpstatus_ptr(tcg_ctx, false);
        TCGv_i32 tcg_ahp = get_ahp_flag(tcg_ctx);
        tcg_gen_ext16u_i32(tcg_ctx, tcg_rn, tcg_rn);
        if (dtype == 0) {
            /* Half to single */
            TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);
            gen_helper_vfp_fcvt_f16_to_f32(tcg_ctx, tcg_rd, tcg_rn, tcg_fpst, tcg_ahp);
            write_fp_sreg(s, rd, tcg_rd);
            tcg_temp_free_i32(tcg_ctx, tcg_rd);
        } else {
            /* Half to double */
            TCGv_i64 tcg_rd = tcg_temp_new_i64(tcg_ctx);
            gen_helper_vfp_fcvt_f16_to_f64(tcg_ctx, tcg_rd, tcg_rn, tcg_fpst, tcg_ahp);
            write_fp_dreg(s, rd, tcg_rd);
            tcg_temp_free_i64(tcg_ctx, tcg_rd);
        }
        tcg_temp_free_i32(tcg_ctx, tcg_rn);
        tcg_temp_free_ptr(tcg_ctx, tcg_fpst);
        tcg_temp_free_i32(tcg_ctx, tcg_ahp);
        break;
    }
    default:
        abort();
    }
}